

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O2

UObject * __thiscall
icu_63::LocaleKeyFactory::create
          (LocaleKeyFactory *this,ICUServiceKey *key,ICUService *service,UErrorCode *status)

{
  int iVar1;
  uint uVar2;
  UObject *pUVar3;
  LocaleKey *lkey;
  Locale loc;
  Locale local_110;
  undefined4 extraout_var;
  
  iVar1 = (*(this->super_ICUServiceFactory).super_UObject._vptr_UObject[6])(this,key,status);
  if ((char)iVar1 == '\0') {
    pUVar3 = (UObject *)0x0;
  }
  else {
    uVar2 = (*(key->super_UObject)._vptr_UObject[10])(key);
    Locale::Locale(&local_110);
    (*(key->super_UObject)._vptr_UObject[0xc])(key,&local_110);
    iVar1 = (*(this->super_ICUServiceFactory).super_UObject._vptr_UObject[7])
                      (this,&local_110,(ulong)uVar2,service,status);
    pUVar3 = (UObject *)CONCAT44(extraout_var,iVar1);
    Locale::~Locale(&local_110);
  }
  return pUVar3;
}

Assistant:

UObject*
LocaleKeyFactory::create(const ICUServiceKey& key, const ICUService* service, UErrorCode& status) const {
    if (handlesKey(key, status)) {
        const LocaleKey& lkey = (const LocaleKey&)key;
        int32_t kind = lkey.kind();
        Locale loc;
        lkey.currentLocale(loc);

        return handleCreate(loc, kind, service, status);
    }
    return NULL;
}